

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::assert_bol_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::dynamic_xpression(dynamic_xpression<boost::xpressive::detail::assert_bol_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this,assert_bol_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                          *matcher)

{
  undefined4 *in_RSI;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  *(undefined4 *)((long)&in_RDI[1].xpr_.px + 4) = *in_RSI;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::matchable_ex(in_stack_ffffffffffffffe0);
  (in_RDI->xpr_).px =
       (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&PTR__dynamic_xpression_0021c628;
  this_00 = in_RDI + 2;
  get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::shared_matchable(this_00,in_RDI);
  return;
}

Assistant:

dynamic_xpression(Matcher const &matcher = Matcher())
      : Matcher(matcher)
      , next_(get_invalid_xpression<BidiIter>())
    {
    }